

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::FlushChunks(idx2_file *Idx2,encode_data *E)

{
  int iVar1;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *Array;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  t2<unsigned_int,_idx2::channel_*> *Beg;
  ulong *puVar9;
  ulong uVar10;
  double dVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  long lVar15;
  FILE *__s;
  size_t sVar16;
  byte *pbVar17;
  int iVar18;
  byte *pbVar19;
  channel *pcVar20;
  i64 iVar21;
  long lVar22;
  long lVar23;
  u64 *puVar24;
  long lVar25;
  chunk_meta_info *Cm;
  chunk_meta_info *pcVar26;
  long *in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM2_Qb;
  stref sVar30;
  file_id FileId;
  anon_union_8_2_2df48d06_for_stref_0 local_70;
  long lStack_68;
  allocator *local_60;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  long lStack_50;
  allocator *local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  lVar25 = -0x8000000000000000;
  Array = &E->SortedChannels;
  GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(Array,(E->Channels).Size);
  (E->SortedChannels).Size = 0;
  lVar15 = (E->Channels).LogCapacity;
  lVar13 = 1L << ((byte)lVar15 & 0x3f);
  lVar23 = -0x8000000000000000;
  if (lVar15 == 0x3f) {
LAB_00199616:
    if (lVar23 == lVar13) {
      lVar22 = 0;
    }
    else {
      pcVar20 = (E->Channels).Vals + lVar23;
      puVar14 = (E->Channels).Keys + lVar23;
      lVar22 = 0;
      do {
        uVar8 = *puVar14;
        iVar21 = lVar22;
        if ((E->SortedChannels).Capacity <= lVar22) {
          GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(Array,0);
          iVar21 = (E->SortedChannels).Size;
        }
        lVar22 = iVar21 + 1;
        (E->SortedChannels).Size = lVar22;
        pbVar19 = (E->SortedChannels).Buffer.Data;
        *(uint *)(pbVar19 + iVar21 * 0x10) = uVar8;
        *(channel **)(pbVar19 + iVar21 * 0x10 + 8) = pcVar20;
        lVar15 = lVar23 * -0xd8;
        lVar13 = lVar23 * -4;
        do {
          lVar15 = lVar15 + -0xd8;
          lVar13 = lVar13 + -4;
          lVar12 = lVar23 + 1;
          lVar23 = lVar23 + 1;
        } while ((E->Channels).Stats[lVar12] != Occupied);
        puVar14 = (uint *)((long)(E->Channels).Keys - lVar13);
        pcVar20 = (channel *)((long)(E->Channels).Vals - lVar15);
      } while (1L << ((byte)(E->Channels).LogCapacity & 0x3f) != lVar23);
    }
  }
  else {
    lVar22 = 0;
    lVar15 = 0;
    if (0 < lVar13) {
      lVar15 = lVar13;
    }
    lVar23 = 0;
    do {
      if ((E->Channels).Stats[lVar23] == Occupied) goto LAB_00199616;
      lVar23 = lVar23 + 1;
    } while (lVar15 + 1 != lVar23);
  }
  Beg = (t2<unsigned_int,_idx2::channel_*> *)(E->SortedChannels).Buffer.Data;
  InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>(Beg,Beg + lVar22);
  if ((E->SortedChannels).Size != 0) {
    puVar14 = (uint *)(Array->Buffer).Data;
    do {
      uVar8 = *puVar14;
      WriteChunk(Idx2,E,*(channel **)(puVar14 + 2),(byte)uVar8 & 0xf,(i8)(uVar8 >> 4),
                 (i16)(uVar8 >> 0x10));
      puVar14 = puVar14 + 4;
    } while (puVar14 != (uint *)((E->SortedChannels).Buffer.Data + (E->SortedChannels).Size * 0x10))
    ;
  }
  lVar23 = (E->ChunkMeta).LogCapacity;
  lVar15 = 1L << ((byte)lVar23 & 0x3f);
  if (lVar23 == 0x3f) {
LAB_00199774:
    if (lVar25 != lVar15) {
      pcVar26 = (E->ChunkMeta).Vals + lVar25;
      puVar24 = (E->ChunkMeta).Keys + lVar25;
      do {
        ConstructFilePath((file_id *)&local_58,Idx2,*puVar24);
        if (local_48 != (allocator *)*puVar24) {
          ConstructFilePath((file_id *)&local_70,Idx2,*puVar24);
          local_48 = local_60;
          local_58 = local_70;
          lStack_50 = lStack_68;
        }
        __s = fopen(local_58.Ptr,"ab");
        if (__s == (FILE *)0x0) {
          local_40.Ptr = local_58.Ptr;
          sVar16 = strlen(local_58.Ptr);
          local_38 = (undefined4)sVar16;
          sVar30 = GetParentPath((stref *)&local_40);
          local_70 = sVar30.field_0;
          lStack_68 = CONCAT44(lStack_68._4_4_,sVar30.Size);
          CreateFullDir((stref *)&local_70);
          __s = fopen(local_58.Ptr,"ab");
        }
        puVar9 = (ulong *)(pcVar26->Sizes).BitPtr;
        uVar10 = (pcVar26->Sizes).BitBuf;
        *puVar9 = uVar10;
        uVar8 = (pcVar26->Sizes).BitPos;
        if (0 < (int)uVar8 >> 3) {
          (pcVar26->Sizes).BitBuf = (uVar10 >> 1) >> (((byte)uVar8 & 0xf8) - 1 & 0x3f);
        }
        pbVar17 = (byte *)((long)puVar9 + (long)((int)uVar8 >> 3));
        (pcVar26->Sizes).BitPtr = pbVar17;
        (pcVar26->Sizes).BitPos = uVar8 & 7;
        pbVar19 = (pcVar26->Sizes).Stream.Data;
        fwrite(pbVar19,(size_t)(pbVar17 + ((ulong)((uVar8 & 7) != 0) - (long)pbVar19)),1,__s);
        iVar18 = (pcVar26->Sizes).BitPos;
        iVar1 = iVar18 + 7;
        iVar18 = iVar18 + 0xe;
        if (-1 < iVar1) {
          iVar18 = iVar1;
        }
        pbVar19 = (pcVar26->Sizes).BitPtr +
                  ((long)(iVar18 >> 3) - (long)(pcVar26->Sizes).Stream.Data);
        auVar27._0_8_ = (double)(long)pbVar19;
        auVar27._8_8_ = in_XMM2_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = _ZN4idx2L14ChunkSizesStatE_0;
        auVar2 = vminsd_avx(auVar27,auVar2);
        _ZN4idx2L14ChunkSizesStatE_0 = auVar2._0_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = _ZN4idx2L14ChunkSizesStatE_1;
        auVar2 = vmaxsd_avx(auVar27,auVar3);
        _ZN4idx2L14ChunkSizesStatE_1 = auVar2._0_8_;
        _ZN4idx2L14ChunkSizesStatE_2 = auVar27._0_8_ + _ZN4idx2L14ChunkSizesStatE_2;
        _ZN4idx2L14ChunkSizesStatE_3 = _ZN4idx2L14ChunkSizesStatE_3 + 1;
        _ZN4idx2L14ChunkSizesStatE_4 = auVar27._0_8_ * auVar27._0_8_ + _ZN4idx2L14ChunkSizesStatE_4;
        local_70._0_4_ = (int)pbVar19;
        fwrite(&local_70,4,1,__s);
        lStack_68 = (pcVar26->Addrs).Size << 3;
        local_70 = (anon_union_8_2_2df48d06_for_stref_0)(pcVar26->Addrs).Buffer.Data;
        local_60 = (pcVar26->Addrs).Buffer.Alloc;
        CompressBufZstd((buffer *)&local_70,&E->CompressedChunkAddresses);
        pbVar19 = (E->CompressedChunkAddresses).Stream.Data;
        iVar18 = (E->CompressedChunkAddresses).BitPos;
        iVar1 = iVar18 + 7;
        iVar18 = iVar18 + 0xe;
        if (-1 < iVar1) {
          iVar18 = iVar1;
        }
        fwrite(pbVar19,(size_t)((E->CompressedChunkAddresses).BitPtr +
                               ((long)(iVar18 >> 3) - (long)pbVar19)),1,__s);
        iVar18 = (E->CompressedChunkAddresses).BitPos;
        iVar1 = iVar18 + 7;
        iVar18 = iVar18 + 0xe;
        if (-1 < iVar1) {
          iVar18 = iVar1;
        }
        local_70._0_4_ =
             (iVar18 >> 3) +
             (*(int *)&(E->CompressedChunkAddresses).BitPtr -
             *(int *)&(E->CompressedChunkAddresses).Stream.Data);
        fwrite(&local_70,4,1,__s);
        local_70._0_4_ = (int)(pcVar26->Addrs).Size;
        fwrite(&local_70,4,1,__s);
        dVar11 = (double)(pcVar26->Addrs).Size * 8.0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_0;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar11;
        auVar2 = vminsd_avx(auVar28,auVar4);
        _ZN4idx2L30UncompressedChunkAddressesStatE_0 = auVar2._0_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_1;
        auVar2 = vmaxsd_avx(auVar28,auVar5);
        _ZN4idx2L30UncompressedChunkAddressesStatE_1 = auVar2._0_8_;
        _ZN4idx2L30UncompressedChunkAddressesStatE_2 =
             dVar11 + _ZN4idx2L30UncompressedChunkAddressesStatE_2;
        _ZN4idx2L30UncompressedChunkAddressesStatE_3 =
             _ZN4idx2L30UncompressedChunkAddressesStatE_3 + 1;
        _ZN4idx2L30UncompressedChunkAddressesStatE_4 =
             dVar11 * dVar11 + _ZN4idx2L30UncompressedChunkAddressesStatE_4;
        iVar18 = (E->CompressedChunkAddresses).BitPos;
        iVar1 = iVar18 + 7;
        iVar18 = iVar18 + 0xe;
        if (-1 < iVar1) {
          iVar18 = iVar1;
        }
        auVar29._0_8_ =
             (double)(long)((E->CompressedChunkAddresses).BitPtr +
                           ((long)(iVar18 >> 3) - (long)(E->CompressedChunkAddresses).Stream.Data));
        auVar29._8_8_ = in_XMM2_Qb;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_0;
        auVar2 = vminsd_avx(auVar29,auVar6);
        _ZN4idx2L28CompressedChunkAddressesStatE_0 = auVar2._0_8_;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_1;
        auVar2 = vmaxsd_avx(auVar29,auVar7);
        _ZN4idx2L28CompressedChunkAddressesStatE_1 = auVar2._0_8_;
        _ZN4idx2L28CompressedChunkAddressesStatE_2 =
             auVar29._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_2;
        _ZN4idx2L28CompressedChunkAddressesStatE_3 = _ZN4idx2L28CompressedChunkAddressesStatE_3 + 1;
        _ZN4idx2L28CompressedChunkAddressesStatE_4 =
             auVar29._0_8_ * auVar29._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_4;
        if (__s != (FILE *)0x0) {
          fclose(__s);
        }
        lVar23 = lVar25 * -0x60;
        lVar15 = lVar25 * -8;
        do {
          lVar23 = lVar23 + -0x60;
          lVar15 = lVar15 + -8;
          lVar13 = lVar25 + 1;
          lVar25 = lVar25 + 1;
        } while ((E->ChunkMeta).Stats[lVar13] != Occupied);
        puVar24 = (u64 *)((long)(E->ChunkMeta).Keys - lVar15);
        pcVar26 = (chunk_meta_info *)((long)(E->ChunkMeta).Vals - lVar23);
      } while (1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f) != lVar25);
    }
  }
  else {
    lVar25 = 0;
    lVar23 = 0;
    if (0 < lVar15) {
      lVar23 = lVar15;
    }
    do {
      if ((E->ChunkMeta).Stats[lVar25] == Occupied) goto LAB_00199774;
      lVar25 = lVar25 + 1;
    } while (lVar23 + 1 != lVar25);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x180;
  return (error<idx2::idx2_err_code>)ZEXT816(0x1bd78d);
}

Assistant:

error<idx2_err_code>
FlushChunks(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedChannels, Size(E->Channels));
    Clear(&E->SortedChannels);
    idx2_ForEach (Ch, E->Channels)
    {
      PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
    }
    InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
    idx2_ForEach (Ch, E->SortedChannels)
    {
      i8 Level = GetLevelFromChannelKey(Ch->First);
      i8 Subband = GetSubbandFromChannelKey(Ch->First);
      i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
      // printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
      WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane); //just call WriteChunk
    }
    return idx2_Error(idx2_err_code::NoError);
  }
#endif
  /* write the chunks */
  Reserve(&E->SortedChannels, Size(E->Channels));
  Clear(&E->SortedChannels);
  idx2_ForEach (Ch, E->Channels)
  {
    PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
  }
  InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
  idx2_ForEach (Ch, E->SortedChannels)
  {
    i8 Level = GetLevelFromChannelKey(Ch->First);
    i8 Subband = GetSubbandFromChannelKey(Ch->First);
    i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
    //printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
    WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane);
  }

  /* write the chunk metadata */
  idx2_ForEach (CmIt, E->ChunkMeta)
  {
    chunk_meta_info* Cm = CmIt.Val;
    file_id FileId = ConstructFilePath(Idx2, *CmIt.Key);
    if (FileId.Id != *CmIt.Key)
    {
      FileId = ConstructFilePath(Idx2, *CmIt.Key);
    }
    //printf("%llu %s\n", FileId.Id, FileId.Name.ConstPtr);
    idx2_Assert(FileId.Id == *CmIt.Key);
    /* compress and write chunk sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(&Cm->Sizes);
    WriteBuffer(Fp, ToBuffer(Cm->Sizes));
    ChunkSizesStat.Add((f64)Size(Cm->Sizes));
    WritePOD(Fp, (int)Size(Cm->Sizes));
    /* compress and write chunk addresses */
    CompressBufZstd(ToBuffer(Cm->Addrs), &E->CompressedChunkAddresses);
    WriteBuffer(Fp, ToBuffer(E->CompressedChunkAddresses));
    // write size of the compressed chunk addresses
    WritePOD(Fp, (int)Size(E->CompressedChunkAddresses));
    WritePOD(Fp, (int)Size(Cm->Addrs)); // number of chunks
    UncompressedChunkAddressesStat.Add((f64)Size(Cm->Addrs) * sizeof(Cm->Addrs[0]));
    CompressedChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
  }

  return idx2_Error(idx2_err_code::NoError);
}